

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

char16_t * __thiscall icu_63::UnicodeString::getBuffer(UnicodeString *this)

{
  UnicodeString *this_local;
  
  if (((this->fUnion).fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      this_local = (UnicodeString *)(this->fUnion).fFields.fArray;
    }
    else {
      this_local = (UnicodeString *)((long)&this->fUnion + 2);
    }
  }
  else {
    this_local = (UnicodeString *)0x0;
  }
  return (char16_t *)this_local;
}

Assistant:

inline const char16_t *
UnicodeString::getBuffer() const {
  if(fUnion.fFields.fLengthAndFlags&(kIsBogus|kOpenGetBuffer)) {
    return nullptr;
  } else if(fUnion.fFields.fLengthAndFlags&kUsingStackBuffer) {
    return fUnion.fStackFields.fBuffer;
  } else {
    return fUnion.fFields.fArray;
  }
}